

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O0

int __thiscall
ncnn::YoloDetectionOutput::forward_inplace
          (YoloDetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs
          ,Option *opt)

{
  value_type vVar1;
  ulong uVar2;
  size_type sVar3;
  float *pfVar4;
  reference pvVar5;
  Mat *pMVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  undefined8 in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  bool bVar10;
  float fVar11;
  float fVar12;
  float *outptr;
  float score_1;
  BBoxRect *r;
  int i_3;
  Mat *top_blob;
  int num_detected;
  size_t z;
  size_t i_2;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<float,_std::allocator<float>_> *box_bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *box_bbox_rects;
  int i_1;
  BBoxRect c;
  float confidence;
  float score;
  int q;
  float class_score;
  int class_index;
  float box_score;
  float bbox_ymax;
  float bbox_xmax;
  float bbox_ymin;
  float bbox_xmin;
  float bbox_h;
  float bbox_w;
  float bbox_cy;
  float bbox_cx;
  int j;
  int i;
  Mat scores;
  float *box_score_ptr;
  float *hptr;
  float *wptr;
  float *yptr;
  float *xptr;
  float bias_h;
  float bias_w;
  int p;
  int pp;
  vector<int,_std::allocator<int>_> softmax_rets;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  all_box_bbox_scores;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  all_box_bbox_rects;
  int channels_per_box;
  int channels;
  int h;
  int w;
  Mat *bottom_top_blob;
  size_t b;
  vector<float,_std::allocator<float>_> all_bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> all_bbox_rects;
  Mat *m_6;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Mat *m_5;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffff438;
  __normal_iterator<const_ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
  *in_stack_fffffffffffff440;
  undefined7 in_stack_fffffffffffff448;
  undefined1 in_stack_fffffffffffff44f;
  reference in_stack_fffffffffffff450;
  reference pvVar13;
  int in_stack_fffffffffffff458;
  int in_stack_fffffffffffff45c;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff460;
  Mat *this_00;
  vector<float,_std::allocator<float>_> *this_01;
  iterator in_stack_fffffffffffff488;
  __normal_iterator<const_ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
  in_stack_fffffffffffff490;
  const_iterator in_stack_fffffffffffff498;
  float in_stack_fffffffffffff4e4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff4e8;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *in_stack_fffffffffffff4f0;
  int local_9ec;
  Mat *local_9d0;
  vector<float,_std::allocator<float>_> local_9c8;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> local_9b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_998;
  float *local_980;
  float *local_978;
  float *local_970;
  float *local_968;
  BBoxRect *local_958;
  BBoxRect *local_950;
  BBoxRect *local_948;
  BBoxRect *local_940;
  reference local_930;
  reference local_928;
  int local_91c;
  float local_918;
  float local_914;
  float local_910;
  float local_90c;
  int local_908;
  float local_904;
  undefined8 local_900;
  undefined8 local_8f8;
  undefined8 local_8f0;
  undefined4 local_8e8;
  Allocator *local_8e0;
  undefined4 local_8d8;
  undefined4 local_8d4;
  undefined4 local_8d0;
  undefined4 local_8cc;
  undefined4 local_8c8;
  undefined8 local_8c0;
  float local_8b4;
  int local_8b0;
  float local_8ac;
  int local_8a8;
  float local_8a4;
  float local_8a0;
  float local_89c;
  float local_898;
  float local_894;
  float local_890;
  float local_88c;
  float local_888;
  float local_884;
  int local_880;
  int local_87c;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> local_878;
  int local_860;
  Allocator *local_858;
  int local_850;
  int local_84c;
  int local_848;
  int local_844;
  undefined4 local_840;
  ulong local_838;
  undefined8 local_830;
  undefined8 local_828;
  undefined8 local_820;
  undefined4 local_818;
  Allocator *local_810;
  undefined4 local_808;
  undefined4 local_804;
  undefined4 local_800;
  undefined4 local_7fc;
  undefined4 local_7f8;
  undefined8 local_7f0;
  void *local_7e8;
  undefined8 local_7e0;
  undefined8 local_7d8;
  undefined8 local_7d0;
  undefined4 local_7c8;
  Allocator *local_7c0;
  undefined4 local_7b8;
  undefined4 local_7b4;
  undefined4 local_7b0;
  undefined4 local_7ac;
  undefined4 local_7a8;
  undefined8 local_7a0;
  float *local_798;
  undefined8 local_790;
  undefined8 local_788;
  undefined8 local_780;
  undefined4 local_778;
  Allocator *local_770;
  undefined4 local_768;
  undefined4 local_764;
  undefined4 local_760;
  undefined4 local_75c;
  undefined4 local_758;
  undefined8 local_750;
  float *local_748;
  undefined8 local_740;
  undefined8 local_738;
  undefined8 local_730;
  undefined4 local_728;
  Allocator *local_720;
  undefined4 local_718;
  undefined4 local_714;
  undefined4 local_710;
  undefined4 local_70c;
  undefined4 local_708;
  undefined8 local_700;
  void *local_6f8;
  undefined8 local_6f0;
  undefined8 local_6e8;
  undefined8 local_6e0;
  undefined4 local_6d8;
  Allocator *local_6d0;
  undefined4 local_6c8;
  undefined4 local_6c4;
  undefined4 local_6c0;
  undefined4 local_6bc;
  undefined4 local_6b8;
  undefined8 local_6b0;
  void *local_6a8;
  float local_6a0;
  float local_69c;
  int local_698;
  int local_694;
  vector<int,_std::allocator<int>_> local_690;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_668;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  local_650;
  int local_634;
  int local_630;
  int local_62c;
  int local_628;
  int local_624;
  reference local_620;
  ulong local_618;
  vector<float,_std::allocator<float>_> local_610;
  vector<float,_std::allocator<float>_> local_5f8;
  undefined8 local_5e0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_5d8;
  int local_5c4;
  undefined8 *local_5c0;
  undefined8 *local_5b0;
  undefined8 *local_5a0;
  undefined8 *local_590;
  undefined8 *local_580;
  undefined8 *local_570;
  BBoxRect *local_560;
  long local_550;
  long *local_548;
  long local_540;
  long *local_538;
  undefined1 local_52d;
  int local_52c;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *local_528;
  undefined8 *local_520;
  undefined1 local_50d;
  int local_50c;
  reference local_508;
  undefined8 *local_500;
  undefined1 local_4ed;
  int local_4ec;
  reference local_4e8;
  undefined8 *local_4e0;
  undefined1 local_4cd;
  int local_4cc;
  reference local_4c8;
  undefined8 *local_4c0;
  undefined1 local_4ad;
  int local_4ac;
  reference local_4a8;
  undefined8 *local_4a0;
  undefined1 local_48d;
  int local_48c;
  reference local_488;
  undefined8 *local_480;
  undefined8 *local_470;
  undefined8 *local_468;
  undefined8 *local_460;
  undefined8 *local_458;
  undefined8 *local_450;
  undefined1 local_441;
  undefined4 local_440;
  int local_43c;
  reference local_438;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *local_430;
  int local_41c;
  reference local_418;
  int local_40c;
  undefined8 *local_408;
  reference local_400;
  float local_378;
  undefined4 local_374;
  BBoxRect *local_370;
  undefined8 *local_350;
  undefined8 *local_330;
  undefined8 *local_310;
  undefined8 *local_2f0;
  undefined8 *local_2d0;
  undefined8 *local_2b0;
  pointer local_248;
  Allocator *local_200;
  int local_1f4;
  size_t local_1f0;
  void *local_1e8;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  undefined8 *local_1d0;
  Allocator *local_1c8;
  int local_1bc;
  size_t local_1b8;
  void *local_1b0;
  int local_1a4;
  int local_1a0;
  int local_19c;
  undefined8 *local_198;
  Allocator *local_190;
  int local_184;
  size_t local_180;
  float *local_178;
  int local_16c;
  int local_168;
  int local_164;
  undefined8 *local_160;
  Allocator *local_158;
  int local_14c;
  size_t local_148;
  float *local_140;
  int local_134;
  int local_130;
  int local_12c;
  undefined8 *local_128;
  Allocator *local_120;
  int local_114;
  size_t local_110;
  void *local_108;
  int local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  Allocator *local_e8;
  int local_dc;
  pointer local_d8;
  float *local_d0;
  int local_c4;
  int local_c0;
  int local_bc;
  undefined8 *local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined4 local_8c;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  Allocator *local_50;
  int local_44;
  pointer local_40;
  pointer local_38;
  undefined4 local_30;
  int local_2c;
  int local_28;
  int local_24;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *local_20;
  undefined4 local_14;
  long local_10;
  reference local_8;
  
  local_5e0 = in_RDX;
  local_5d8 = in_RSI;
  std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::vector
            ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)0x167ab1c);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x167ab29);
  local_618 = 0;
  do {
    uVar2 = local_618;
    sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_5d8);
    if (sVar3 <= uVar2) {
      qsort_descent_inplace<ncnn::BBoxRect>
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffff450,
                 (vector<float,_std::allocator<float>_> *)
                 CONCAT17(in_stack_fffffffffffff44f,in_stack_fffffffffffff448));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x167d45b);
      nms_sorted_bboxes(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8,
                        in_stack_fffffffffffff4e4);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::vector
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)0x167d48c);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x167d499);
      local_9d0 = (Mat *)0x0;
      pvVar13 = in_stack_fffffffffffff450;
      while (this_00 = local_9d0,
            pMVar6 = (Mat *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                      (&local_998), this_00 < pMVar6) {
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_998,(size_type)local_9d0);
        sVar3 = *pvVar7;
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::operator[]
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_5f8,sVar3);
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)pvVar13,
                   (value_type *)CONCAT17(in_stack_fffffffffffff44f,in_stack_fffffffffffff448));
        std::vector<float,_std::allocator<float>_>::operator[](&local_610,sVar3);
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)pvVar13,
                   (value_type_conflict *)
                   CONCAT17(in_stack_fffffffffffff44f,in_stack_fffffffffffff448));
        local_9d0 = (Mat *)((long)&local_9d0->data + 1);
      }
      sVar3 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::size(&local_9b0);
      if ((int)sVar3 == 0) {
        local_5c4 = 0;
        in_stack_fffffffffffff450 = pvVar13;
      }
      else {
        in_stack_fffffffffffff450 =
             std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_5d8,0);
        Mat::create(this_00,in_stack_fffffffffffff45c,in_stack_fffffffffffff458,(size_t)pvVar13,
                    (Allocator *)CONCAT17(in_stack_fffffffffffff44f,in_stack_fffffffffffff448));
        bVar10 = true;
        if (in_stack_fffffffffffff450->data != (void *)0x0) {
          bVar10 = in_stack_fffffffffffff450->cstep * (long)in_stack_fffffffffffff450->c == 0;
          local_8 = in_stack_fffffffffffff450;
        }
        local_400 = in_stack_fffffffffffff450;
        if (bVar10) {
          local_5c4 = -100;
        }
        else {
          pvVar13 = in_stack_fffffffffffff450;
          for (local_9ec = 0; local_9ec < (int)sVar3; local_9ec = local_9ec + 1) {
            pvVar8 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::operator[]
                               (&local_9b0,(long)local_9ec);
            pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                               (&local_9c8,(long)local_9ec);
            vVar1 = *pvVar9;
            local_41c = local_9ec;
            pfVar4 = (float *)((long)in_stack_fffffffffffff450->data +
                              (long)in_stack_fffffffffffff450->w * (long)local_9ec *
                              in_stack_fffffffffffff450->elemsize);
            *pfVar4 = (float)pvVar8->label + 1.0;
            pfVar4[1] = vVar1;
            pfVar4[2] = pvVar8->xmin;
            pfVar4[3] = pvVar8->ymin;
            pfVar4[4] = pvVar8->xmax;
            pfVar4[5] = pvVar8->ymax;
            local_418 = in_stack_fffffffffffff450;
          }
          local_5c4 = 0;
          in_stack_fffffffffffff450 = pvVar13;
        }
      }
      local_634 = 1;
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff450);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~vector
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffff450);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff450)
      ;
LAB_0167d875:
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff450);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~vector
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffff450);
      return local_5c4;
    }
    local_620 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_5d8,local_618);
    local_624 = local_620->w;
    local_628 = local_620->h;
    local_62c = local_620->c;
    local_630 = local_62c / *(int *)(in_RDI + 0xd4);
    if (local_630 != *(int *)(in_RDI + 0xd0) + 5) {
      local_5c4 = -1;
      local_634 = 1;
      goto LAB_0167d875;
    }
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              *)0x167ac1a);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)0x167ac27);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::resize((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              *)in_stack_fffffffffffff460,
             CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458));
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)in_stack_fffffffffffff460,
             CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458));
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x167ac78);
    std::vector<int,_std::allocator<int>_>::resize
              (in_stack_fffffffffffff460,
               CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458));
    for (local_694 = 0; local_694 < *(int *)(in_RDI + 0xd4); local_694 = local_694 + 1) {
      local_698 = local_694 * local_630;
      local_538 = (long *)(in_RDI + 0xe0);
      local_540 = (long)(local_694 << 1);
      local_69c = *(float *)(*local_538 + local_540 * 4);
      local_548 = (long *)(in_RDI + 0xe0);
      local_550 = (long)(local_694 * 2 + 1);
      local_6a0 = *(float *)(*local_548 + local_550 * 4);
      local_480 = &local_6f0;
      local_1d4 = local_620->w;
      local_1d8 = local_620->h;
      local_1dc = local_620->d;
      local_6a8 = (void *)((long)local_620->data +
                          local_620->cstep * (long)local_698 * local_620->elemsize);
      local_1f0 = local_620->elemsize;
      local_1f4 = local_620->elempack;
      local_200 = local_620->allocator;
      local_1d0 = &local_6f0;
      local_58 = (long)local_1d4 * (long)local_1d8 * local_1f0;
      local_450 = &local_6f0;
      local_5c0 = &local_6f0;
      local_4ac = local_698 + 1;
      local_4a0 = &local_740;
      local_19c = local_620->w;
      local_1a0 = local_620->h;
      local_1a4 = local_620->d;
      local_6f8 = (void *)((long)local_620->data +
                          local_620->cstep * (long)local_4ac * local_620->elemsize);
      local_1b8 = local_620->elemsize;
      local_1bc = local_620->elempack;
      local_1c8 = local_620->allocator;
      local_198 = &local_740;
      local_68 = (long)local_19c * (long)local_1a0 * local_1b8;
      local_458 = &local_740;
      local_5b0 = &local_740;
      local_4cc = local_698 + 2;
      local_4c0 = &local_790;
      local_164 = local_620->w;
      local_168 = local_620->h;
      local_16c = local_620->d;
      local_748 = (float *)((long)local_620->data +
                           local_620->cstep * (long)local_4cc * local_620->elemsize);
      local_180 = local_620->elemsize;
      local_184 = local_620->elempack;
      local_190 = local_620->allocator;
      local_160 = &local_790;
      local_78 = (long)local_164 * (long)local_168 * local_180;
      local_460 = &local_790;
      local_5a0 = &local_790;
      local_4ec = local_698 + 3;
      local_4e0 = &local_7e0;
      local_12c = local_620->w;
      local_130 = local_620->h;
      local_134 = local_620->d;
      local_798 = (float *)((long)local_620->data +
                           local_620->cstep * (long)local_4ec * local_620->elemsize);
      local_148 = local_620->elemsize;
      local_14c = local_620->elempack;
      local_158 = local_620->allocator;
      local_128 = &local_7e0;
      local_88 = (long)local_12c * (long)local_130 * local_148;
      local_468 = &local_7e0;
      local_590 = &local_7e0;
      local_50c = local_698 + 4;
      local_500 = &local_830;
      local_f4 = local_620->w;
      local_f8 = local_620->h;
      local_fc = local_620->d;
      local_7e8 = (void *)((long)local_620->data +
                          local_620->cstep * (long)local_50c * local_620->elemsize);
      local_110 = local_620->elemsize;
      local_114 = local_620->elempack;
      local_120 = local_620->allocator;
      local_f0 = &local_830;
      local_98 = (long)local_f4 * (long)local_f8 * local_110;
      local_470 = &local_830;
      local_580 = &local_830;
      local_6b8 = 0;
      local_6bc = 0;
      local_6c0 = 0;
      local_6c4 = 0;
      local_6d8 = 0;
      local_6e0 = 0;
      local_6e8 = 0;
      local_6f0 = 0;
      local_708 = 0;
      local_70c = 0;
      local_710 = 0;
      local_714 = 0;
      local_728 = 0;
      local_730 = 0;
      local_738 = 0;
      local_740 = 0;
      local_758 = 0;
      local_75c = 0;
      local_760 = 0;
      local_764 = 0;
      local_778 = 0;
      local_780 = 0;
      local_788 = 0;
      local_790 = 0;
      local_7a8 = 0;
      local_7ac = 0;
      local_7b0 = 0;
      local_7b4 = 0;
      local_7c8 = 0;
      local_7d0 = 0;
      local_7d8 = 0;
      local_7e0 = 0;
      local_5c = 0x10;
      local_6c = 0x10;
      local_7c = 0x10;
      local_8c = 0x10;
      local_9c = 0x10;
      local_488 = local_620;
      local_48d = 1;
      local_4a8 = local_620;
      local_4ad = 1;
      local_4c8 = local_620;
      local_4cd = 1;
      local_4e8 = local_620;
      local_4ed = 1;
      local_508 = local_620;
      local_50d = 1;
      local_6b0 = 0;
      local_6c8 = 0;
      local_700 = 0;
      local_718 = 0;
      local_750 = 0;
      local_768 = 0;
      local_7a0 = 0;
      local_7b8 = 0;
      local_830 = 0;
      local_820 = 0;
      local_818 = 0;
      local_804 = 0;
      local_800 = 0;
      local_7fc = 0;
      local_7f8 = 0;
      local_828 = 0;
      local_43c = local_698 + 5;
      local_440 = *(undefined4 *)(in_RDI + 0xd0);
      local_430 = &local_878;
      local_24 = local_620->w;
      local_28 = local_620->h;
      local_2c = local_620->d;
      local_38 = (pointer)((long)local_620->data +
                          local_620->cstep * (long)local_43c * local_620->elemsize);
      local_40 = (pointer)local_620->elemsize;
      local_44 = local_620->elempack;
      local_50 = local_620->allocator;
      in_stack_fffffffffffff4f0 = &local_878;
      local_878.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_10 = (long)local_24 * (long)local_28 * (long)local_2c * (long)local_40;
      local_838 = (local_10 + 0xfU & 0xfffffffffffffff0) / (ulong)local_40;
      local_850 = local_620->dims;
      local_14 = 0x10;
      local_438 = local_620;
      local_441 = 1;
      local_7f0 = 0;
      local_808 = 0;
      local_48c = local_698;
      local_330 = local_580;
      local_310 = local_590;
      local_2f0 = local_5a0;
      local_2d0 = local_5b0;
      local_2b0 = local_5c0;
      local_1e8 = local_6a8;
      local_1b0 = local_6f8;
      local_178 = local_748;
      local_140 = local_798;
      local_108 = local_7e8;
      local_30 = local_440;
      local_20 = in_stack_fffffffffffff4f0;
      local_878.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_start = local_38;
      local_878.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_40;
      local_860 = local_44;
      local_858 = local_50;
      local_84c = local_24;
      local_848 = local_28;
      local_844 = local_2c;
      local_840 = local_440;
      local_810 = local_120;
      local_7c0 = local_158;
      local_770 = local_190;
      local_720 = local_1c8;
      local_6d0 = local_200;
      in_stack_fffffffffffff4e4 =
           (float)(**(code **)(**(long **)(in_RDI + 0x128) + 0x48))
                            (*(long **)(in_RDI + 0x128),&local_878,local_5e0);
      pfVar4 = (float *)std::vector<int,_std::allocator<int>_>::operator[]
                                  (&local_690,(long)local_694);
      *pfVar4 = in_stack_fffffffffffff4e4;
      for (local_87c = 0; local_87c < local_628; local_87c = local_87c + 1) {
        for (local_880 = 0; local_880 < local_624; local_880 = local_880 + 1) {
          fVar11 = (float)local_880;
          fVar12 = sigmoid(0.0);
          local_884 = (fVar11 + fVar12) / (float)local_624;
          fVar11 = (float)local_87c;
          fVar12 = sigmoid(0.0);
          local_888 = (fVar11 + fVar12) / (float)local_628;
          fVar11 = expf(*local_748);
          local_88c = (fVar11 * local_69c) / (float)local_624;
          fVar11 = expf(*local_798);
          local_890 = (fVar11 * local_6a0) / (float)local_628;
          local_894 = local_884 - local_88c * 0.5;
          local_898 = local_888 - local_890 * 0.5;
          local_89c = local_884 + local_88c * 0.5;
          local_8a0 = local_888 + local_890 * 0.5;
          local_8a4 = sigmoid(0.0);
          local_8a8 = 0;
          local_8ac = 0.0;
          for (local_8b0 = 0; local_8b0 < *(int *)(in_RDI + 0xd0); local_8b0 = local_8b0 + 1) {
            local_520 = &local_900;
            local_528 = &local_878;
            local_d0 = (float *)((long)&(local_878.
                                         super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->xmin +
                                local_838 * (long)local_8b0 *
                                (long)local_878.
                                      super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_b8 = &local_900;
            local_8e0 = local_858;
            local_a8 = (long)local_84c * (long)local_848 *
                       (long)local_878.
                             super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
            local_ac = 0x10;
            local_bc = local_84c;
            local_c0 = local_848;
            local_c4 = local_844;
            local_d8 = local_878.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_dc = local_860;
            local_e8 = local_858;
            local_52c = local_8b0;
            local_52d = 1;
            local_408 = &local_900;
            local_40c = local_87c;
            local_8b4 = *(float *)((long)local_d0 +
                                  (long)local_880 * 4 +
                                  (long)local_84c * (long)local_87c *
                                  (long)local_878.
                                        super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_570 = &local_900;
            local_900 = 0;
            local_8f0 = 0;
            local_8e8 = 0;
            local_8d8 = 0;
            local_8d4 = 0;
            local_8d0 = 0;
            local_8cc = 0;
            local_8c8 = 0;
            local_8c0 = 0;
            local_8f8 = 0;
            if (local_8ac < local_8b4) {
              local_8a8 = local_8b0;
              local_8ac = local_8b4;
            }
            local_350 = local_570;
          }
          local_904 = local_8a4 * local_8ac;
          if (*(float *)(in_RDI + 0xd8) <= local_904) {
            local_918 = local_894;
            local_914 = local_898;
            local_910 = local_89c;
            local_90c = local_8a0;
            local_908 = local_8a8;
            std::
            vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
            ::operator[](&local_650,(long)local_694);
            std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                      ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                       in_stack_fffffffffffff450,
                       (value_type *)CONCAT17(in_stack_fffffffffffff44f,in_stack_fffffffffffff448));
            std::
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ::operator[](&local_668,(long)local_694);
            std::vector<float,_std::allocator<float>_>::push_back
                      ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff450,
                       (value_type_conflict *)
                       CONCAT17(in_stack_fffffffffffff44f,in_stack_fffffffffffff448));
          }
          local_6a8 = (void *)((long)local_6a8 + 4);
          local_6f8 = (void *)((long)local_6f8 + 4);
          local_748 = local_748 + 1;
          local_798 = local_798 + 1;
          local_7e8 = (void *)((long)local_7e8 + 4);
        }
      }
      in_stack_fffffffffffff498._M_current = (BBoxRect *)&local_878;
      local_560 = in_stack_fffffffffffff498._M_current;
      local_370 = in_stack_fffffffffffff498._M_current;
      if (local_878.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        local_374 = 0xffffffff;
        LOCK();
        local_378 = (local_878.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                     _M_impl.super__Vector_impl_data._M_finish)->xmin;
        (local_878.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
         super__Vector_impl_data._M_finish)->xmin =
             (float)((int)(local_878.
                           super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                           _M_impl.super__Vector_impl_data._M_finish)->xmin + -1);
        UNLOCK();
        if (local_378 == 1.4013e-45) {
          if (local_858 == (Allocator *)0x0) {
            local_248 = local_878.
                        super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
                        super__Vector_impl_data._M_start;
            if (local_878.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              free(local_878.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                   _M_impl.super__Vector_impl_data._M_start);
            }
          }
          else {
            (*local_858->_vptr_Allocator[3])
                      (local_858,
                       local_878.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                       ._M_impl.super__Vector_impl_data._M_start);
          }
        }
      }
      (in_stack_fffffffffffff498._M_current)->xmin = 0.0;
      (in_stack_fffffffffffff498._M_current)->ymin = 0.0;
      *(pointer *)&(in_stack_fffffffffffff498._M_current)->label = (pointer)0x0;
      in_stack_fffffffffffff498._M_current[1].ymin = 0.0;
      in_stack_fffffffffffff498._M_current[2].xmin = 0.0;
      in_stack_fffffffffffff498._M_current[2].ymin = 0.0;
      in_stack_fffffffffffff498._M_current[2].xmax = 0.0;
      in_stack_fffffffffffff498._M_current[2].ymax = 0.0;
      in_stack_fffffffffffff498._M_current[2].label = 0;
      *(pointer *)&in_stack_fffffffffffff498._M_current[3].ymin = (pointer)0x0;
      *(pointer *)&(in_stack_fffffffffffff498._M_current)->xmax = (pointer)0x0;
    }
    for (local_91c = 0; local_91c < *(int *)(in_RDI + 0xd4); local_91c = local_91c + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_690,(long)local_91c);
      if (*pvVar5 != 0) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_690,(long)local_91c);
        local_5c4 = *pvVar5;
        local_634 = 1;
        goto LAB_0167d3b3;
      }
      local_928 = std::
                  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                  ::operator[](&local_650,(long)local_91c);
      local_930 = std::
                  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ::operator[](&local_668,(long)local_91c);
      this_01 = &local_5f8;
      local_940 = (BBoxRect *)
                  std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::end
                            ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                             in_stack_fffffffffffff438);
      __gnu_cxx::
      __normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>
      ::__normal_iterator<ncnn::BBoxRect*>
                (in_stack_fffffffffffff440,
                 (__normal_iterator<ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
                  *)in_stack_fffffffffffff438);
      local_948 = (BBoxRect *)
                  std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::begin
                            ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                             in_stack_fffffffffffff438);
      local_950 = (BBoxRect *)
                  std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::end
                            ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                             in_stack_fffffffffffff438);
      in_stack_fffffffffffff488 =
           std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
           insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>,void>
                     ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)this_01,
                      in_stack_fffffffffffff498,in_stack_fffffffffffff490,
                      in_stack_fffffffffffff488._M_current);
      local_958 = in_stack_fffffffffffff488._M_current;
      local_968 = (float *)std::vector<float,_std::allocator<float>_>::end
                                     (in_stack_fffffffffffff438);
      __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
      __normal_iterator<float*>
                ((__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
                 in_stack_fffffffffffff440,
                 (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                 in_stack_fffffffffffff438);
      local_970 = (float *)std::vector<float,_std::allocator<float>_>::begin
                                     (in_stack_fffffffffffff438);
      local_978 = (float *)std::vector<float,_std::allocator<float>_>::end
                                     (in_stack_fffffffffffff438);
      local_980 = (float *)std::vector<float,std::allocator<float>>::
                           insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
                                     (this_01,(const_iterator)in_stack_fffffffffffff498._M_current,
                                      (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
                                       )in_stack_fffffffffffff490._M_current,
                                      (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
                                       )in_stack_fffffffffffff488._M_current);
    }
    local_634 = 0;
LAB_0167d3b3:
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff450);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *)in_stack_fffffffffffff450);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
               *)in_stack_fffffffffffff450);
    if (local_634 != 0) goto LAB_0167d875;
    local_618 = local_618 + 1;
  } while( true );
}

Assistant:

int YoloDetectionOutput::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;
    std::vector<float> all_bbox_scores;

    for (size_t b = 0; b < bottom_top_blobs.size(); b++)
    {
        Mat& bottom_top_blob = bottom_top_blobs[b];

        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;

        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        std::vector<std::vector<float> > all_box_bbox_scores;
        all_box_bbox_rects.resize(num_box);
        all_box_bbox_scores.resize(num_box);

        std::vector<int> softmax_rets;
        softmax_rets.resize(num_box);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;

            const float bias_w = biases[pp * 2];
            const float bias_h = biases[pp * 2 + 1];

            const float* xptr = bottom_top_blob.channel(p);
            const float* yptr = bottom_top_blob.channel(p + 1);
            const float* wptr = bottom_top_blob.channel(p + 2);
            const float* hptr = bottom_top_blob.channel(p + 3);

            const float* box_score_ptr = bottom_top_blob.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blob.channel_range(p + 5, num_class);
            softmax_rets[pp] = softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    // region box
                    float bbox_cx = (j + sigmoid(xptr[0])) / w;
                    float bbox_cy = (i + sigmoid(yptr[0])) / h;
                    float bbox_w = expf(wptr[0]) * bias_w / w;
                    float bbox_h = expf(hptr[0]) * bias_h / h;

                    float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                    float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                    float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                    float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                    // box score
                    float box_score = sigmoid(box_score_ptr[0]);

                    // find class index with max class score
                    int class_index = 0;
                    float class_score = 0.f;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }

                    //                 NCNN_LOGE("%d %f %f", class_index, box_score, class_score);

                    float confidence = box_score * class_score;
                    if (confidence >= confidence_threshold)
                    {
                        BBoxRect c = {bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                        all_box_bbox_scores[pp].push_back(confidence);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            if (softmax_rets[i] != 0)
                return softmax_rets[i];

            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];
            const std::vector<float>& box_bbox_scores = all_box_bbox_scores[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
            all_bbox_scores.insert(all_bbox_scores.end(), box_bbox_scores.begin(), box_bbox_scores.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects, all_bbox_scores);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
        bbox_scores.push_back(all_bbox_scores[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = bottom_top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = r.label + 1.0f; // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}